

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O3

Vector<3> *
Omega_h::inertia::anon_unknown_0::get_center
          (Vector<3> *__return_storage_ptr__,CommPtr *comm,Reals *coords,Reals *masses,
          Real total_mass)

{
  int *piVar1;
  double dVar2;
  Alloc *pAVar3;
  int iVar4;
  Int i_1;
  undefined8 extraout_RAX;
  Vector<3> *pVVar5;
  Vector<3> *extraout_RAX_00;
  long lVar6;
  long lVar7;
  Int i;
  long lVar8;
  IntIterator last;
  size_t sVar9;
  Write<double> weighted_coords;
  Vector<3> result;
  type f;
  Vector<3> c;
  Write<double> local_148;
  undefined1 local_138 [32];
  Alloc *local_118;
  void *local_110;
  Alloc *local_108;
  void *pvStack_100;
  Alloc *local_f8;
  void *pvStack_f0;
  Alloc *local_e8;
  void *pvStack_e0;
  Write<double> local_d0;
  CommPtr local_c0;
  Real local_b0;
  Read<signed_char> local_a8;
  Alloc *local_98;
  void *local_90;
  Alloc *local_88;
  void *local_80;
  Alloc *local_78;
  void *local_70;
  double local_68 [4];
  double local_48 [3];
  
  pAVar3 = (masses->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar9 = pAVar3->size;
  }
  else {
    sVar9 = (ulong)pAVar3 >> 3;
  }
  local_138._0_8_ = (Alloc *)(local_138 + 0x10);
  local_b0 = total_mass;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"");
  iVar4 = (int)(sVar9 >> 3);
  Write<double>::Write(&local_148,iVar4 * 3,(string *)local_138);
  if ((Alloc *)local_138._0_8_ != (Alloc *)(local_138 + 0x10)) {
    operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
  }
  local_98 = local_148.shared_alloc_.alloc;
  if (((ulong)local_148.shared_alloc_.alloc & 7) == 0 &&
      local_148.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98 = (Alloc *)((local_148.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_148.shared_alloc_.alloc)->use_count = (local_148.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90 = local_148.shared_alloc_.direct_ptr;
  local_88 = (masses->write_).shared_alloc_.alloc;
  if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88 = (Alloc *)(local_88->size * 8 + 1);
    }
    else {
      local_88->use_count = local_88->use_count + 1;
    }
  }
  local_80 = (masses->write_).shared_alloc_.direct_ptr;
  local_78 = (coords->write_).shared_alloc_.alloc;
  if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78 = (Alloc *)(local_78->size * 8 + 1);
    }
    else {
      local_78->use_count = local_78->use_count + 1;
    }
  }
  local_70 = (coords->write_).shared_alloc_.direct_ptr;
  local_108 = local_98;
  if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108 = (Alloc *)(local_98->size * 8 + 1);
    }
    else {
      local_98->use_count = local_98->use_count + 1;
    }
  }
  pvStack_100 = local_148.shared_alloc_.direct_ptr;
  local_f8 = local_88;
  if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8 = (Alloc *)(local_88->size * 8 + 1);
    }
    else {
      local_88->use_count = local_88->use_count + 1;
    }
  }
  local_e8 = local_78;
  if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8 = (Alloc *)(local_78->size * 8 + 1);
    }
    else {
      local_78->use_count = local_78->use_count + 1;
    }
  }
  pvStack_f0 = local_80;
  pvStack_e0 = local_70;
  if (0 < iVar4) {
    local_138._0_8_ = local_108;
    local_138._8_8_ = local_148.shared_alloc_.direct_ptr;
    if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
      local_108->use_count = local_108->use_count + -1;
      local_138._0_8_ = (Alloc *)(local_108->size * 8 + 1);
    }
    local_108 = (Alloc *)0x0;
    pvStack_100 = (void *)0x0;
    local_138._16_8_ = local_f8;
    if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
      local_f8->use_count = local_f8->use_count + -1;
      local_138._16_8_ = (Alloc *)(local_f8->size * 8 + 1);
    }
    local_f8 = (Alloc *)0x0;
    pvStack_f0 = (void *)0x0;
    local_118 = local_e8;
    if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
      local_e8->use_count = local_e8->use_count + -1;
      local_118 = (Alloc *)(local_e8->size * 8 + 1);
    }
    local_e8 = (Alloc *)0x0;
    pvStack_e0 = (void *)0x0;
    entering_parallel = '\0';
    lVar6 = 0;
    do {
      dVar2 = *(double *)((long)local_80 + lVar6 * 8);
      lVar7 = (lVar6 << 0x20) * 3 >> 0x1d;
      local_68[2] = (double)*(undefined8 *)((long)local_70 + lVar7 + 0x10);
      local_68[0] = *(double *)((long)local_70 + lVar7);
      local_68[1] = ((double *)((long)local_70 + lVar7))[1];
      lVar8 = 0;
      do {
        local_48[lVar8] = local_68[lVar8] * dVar2;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      *(double *)((long)local_148.shared_alloc_.direct_ptr + lVar7 + 0x10) = local_48[2];
      *(double *)((long)local_148.shared_alloc_.direct_ptr + lVar7) = local_48[0];
      ((double *)((long)local_148.shared_alloc_.direct_ptr + lVar7))[1] = local_48[1];
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 != iVar4);
    local_138._24_8_ = local_80;
    local_110 = local_70;
    (anonymous_namespace)::
    get_center(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,double)::
    $_0::~__0((__0 *)local_138);
  }
  (anonymous_namespace)::
  get_center(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,double)::$_0
  ::~__0((__0 *)&local_108);
  local_c0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_c0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_c0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_c0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_c0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_d0.shared_alloc_.alloc = local_148.shared_alloc_.alloc;
  if (((ulong)local_148.shared_alloc_.alloc & 7) == 0 &&
      local_148.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d0.shared_alloc_.alloc = (Alloc *)((local_148.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_148.shared_alloc_.alloc)->use_count = (local_148.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_d0.shared_alloc_.direct_ptr = local_148.shared_alloc_.direct_ptr;
  Read<double>::Read(&local_a8,&local_d0);
  repro_sum(&local_c0,(Reals *)&local_a8,3,(Real *)&local_108);
  if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_a8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a8.write_.shared_alloc_.alloc);
      operator_delete(local_a8.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar3 = local_d0.shared_alloc_.alloc;
  if (((ulong)local_d0.shared_alloc_.alloc & 7) == 0 && local_d0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_d0.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d0.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (local_c0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_138._16_8_ = local_f8;
  local_138._0_8_ = local_108;
  local_138._8_8_ = pvStack_100;
  lVar6 = 0;
  do {
    (__return_storage_ptr__->super_Few<double,_3>).array_[lVar6] =
         *(double *)(local_138 + lVar6 * 8) / local_b0;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  (anonymous_namespace)::
  get_center(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,double)::$_0
  ::~__0((__0 *)&local_98);
  pVVar5 = (Vector<3> *)
           CONCAT71((int7)((ulong)extraout_RAX >> 8),local_148.shared_alloc_.alloc == (Alloc *)0x0);
  if (((ulong)local_148.shared_alloc_.alloc & 7) == 0 &&
      local_148.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_148.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_148.shared_alloc_.alloc);
      operator_delete(local_148.shared_alloc_.alloc,0x48);
      pVVar5 = extraout_RAX_00;
    }
  }
  return pVVar5;
}

Assistant:

Vector<3> get_center(
    CommPtr comm, Reals coords, Reals masses, Real total_mass) {
  auto n = masses.size();
  Write<Real> weighted_coords(n * 3);
  auto f = OMEGA_H_LAMBDA(LO i) {
    set_vector<3>(weighted_coords, i, masses[i] * get_vector<3>(coords, i));
  };
  parallel_for(n, f, "get_center");
  Vector<3> result;
  repro_sum(comm, Reals(weighted_coords), 3, &result[0]);
  return result / total_mass;
}